

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeSSA.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_111::TypeSSA::run(TypeSSA *this,Module *module_)

{
  Module *wasm;
  bool bVar1;
  anon_class_16_2_f5d55917 visitor;
  undefined1 local_178 [8];
  NewFinder moduleFinder;
  anon_class_1_0_00000001 local_71;
  Func local_70;
  undefined1 local_50 [8];
  ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  Module *module__local;
  TypeSSA *this_local;
  
  this->module = module_;
  analysis.map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)module_;
  bVar1 = FeatureSet::hasGC(&this->module->features);
  if (bVar1) {
    wasm = this->module;
    std::
    function<void(wasm::Function*,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&)>
    ::
    function<wasm::(anonymous_namespace)::TypeSSA::run(wasm::Module*)::_lambda(wasm::Function*,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&)_1_,void>
              ((function<void(wasm::Function*,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>&)>
                *)&local_70,&local_71);
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_50,wasm,&local_70);
    std::
    function<void_(wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&)>
    ::~function((function<void_(wasm::Function_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&)>
                 *)&local_70);
    NewFinder::NewFinder((NewFinder *)local_178);
    Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
    ::walkModuleCode((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                      *)local_178,this->module);
    visitor.analysis =
         (ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
          *)module_;
    visitor.this = (TypeSSA *)local_50;
    wasm::ModuleUtils::
    iterDefinedFunctions<wasm::(anonymous_namespace)::TypeSSA::run(wasm::Module*)::_lambda(wasm::Function*)_1_>
              ((ModuleUtils *)this->module,(Module *)this,visitor);
    processNews(this,(News *)&moduleFinder.
                              super_PostWalker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                              .
                              super_Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                              .currModule);
    modifyNews(this);
    NewFinder::~NewFinder((NewFinder *)local_178);
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::~ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)local_50);
  }
  return;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    if (!module->features.hasGC()) {
      return;
    }

    // First, find all the struct/array.news.

    ModuleUtils::ParallelFunctionAnalysis<News> analysis(
      *module, [&](Function* func, News& news) {
        if (func->imported()) {
          return;
        }

        NewFinder finder;
        finder.walk(func->body);
        news = std::move(finder.news);
      });

    // Also find news in the module scope.
    NewFinder moduleFinder;
    moduleFinder.walkModuleCode(module);

    // Process all the news to find the ones we want to modify, adding them to
    // newsToModify. Note that we must do so in a deterministic order.
    ModuleUtils::iterDefinedFunctions(
      *module, [&](Function* func) { processNews(analysis.map[func]); });
    processNews(moduleFinder.news);

    // Modify the ones we found are relevant. We must modify them all at once as
    // in the isorecursive type system we want to create a single new rec group
    // for them all (see below).
    modifyNews();
  }